

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

string * __thiscall
slang::TimeScaleValue::toString_abi_cxx11_(string *__return_storage_ptr__,TimeScaleValue *this)

{
  string_view local_20;
  
  std::__cxx11::to_string(__return_storage_ptr__,(uint)this->magnitude);
  local_20 = timeUnitToSuffix(this->unit);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeScaleValue::toString() const {
    std::string result = std::to_string(int(magnitude));
    result.append(timeUnitToSuffix(unit));
    return result;
}